

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall lest::confirm::~confirm(confirm *this)

{
  pointer pcVar1;
  text *ptVar2;
  ostream *poVar3;
  _Alloc_hider _Var4;
  long *local_130;
  long local_128;
  undefined1 local_120;
  uint7 uStack_11f;
  undefined8 uStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  long *local_f0;
  long local_e8;
  long local_e0;
  undefined8 uStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  text local_90;
  text local_70;
  text local_50;
  
  if (this->failures < 1) {
    if ((this->output).opt.pass != true) goto LAB_001d22c3;
    poVar3 = (this->super_action).os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"All ",4);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," selected ",10);
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"test","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    if (local_110 == &local_100) {
      local_70.field_2._8_8_ = local_100._8_8_;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)local_110;
    }
    local_70._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_110 = &local_100;
    pluralise(&local_90,&local_70,this->selected);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_130 = (long *)&local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"passed.\n","");
    local_e8 = local_128;
    if (local_130 == (long *)&local_120) {
      uStack_b8 = uStack_118;
      local_130 = &local_c0;
    }
    local_128 = 0;
    local_120 = 0;
    if (local_130 == &local_c0) {
      uStack_d8 = uStack_b8;
      local_130 = &local_e0;
    }
    local_c8 = 0;
    local_c0 = (ulong)uStack_11f << 8;
    local_f0 = local_130;
    local_130 = (long *)&local_120;
    local_d0 = &local_c0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_f0,local_e8);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_130 != (long *)&local_120) {
      operator_delete(local_130);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    ptVar2 = &local_70;
    _Var4._M_p = local_70._M_dataplus._M_p;
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," out of ",8);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," selected ",10);
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"test","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if (local_110 == &local_100) {
      local_50.field_2._8_8_ = local_100._8_8_;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)local_110;
    }
    local_50._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_110 = &local_100;
    pluralise(&local_90,&local_50,this->selected);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_130 = (long *)&local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"failed.\n","");
    local_e8 = local_128;
    if (local_130 == (long *)&local_120) {
      uStack_98 = uStack_118;
      local_130 = &local_a0;
    }
    local_128 = 0;
    local_120 = 0;
    if (local_130 == &local_a0) {
      uStack_d8 = uStack_98;
      local_130 = &local_e0;
    }
    local_a8 = 0;
    local_a0 = (ulong)uStack_11f << 8;
    local_f0 = local_130;
    local_130 = (long *)&local_120;
    local_b0 = &local_a0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_f0,local_e8);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_130 != (long *)&local_120) {
      operator_delete(local_130);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    ptVar2 = &local_50;
    _Var4._M_p = local_50._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != &ptVar2->field_2) {
    operator_delete(_Var4._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
LAB_001d22c3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->output).ctx);
  pcVar1 = (this->output).testing._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->output).testing.field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }